

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::ImageInfiniteLight::ImageInfiniteLight
          (ImageInfiniteLight *this,Transform *renderFromLight,Image *im,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,Allocator alloc)

{
  float *pfVar1;
  pointer pcVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  memory_resource *pmVar20;
  size_t sVar21;
  int iVar22;
  Allocator alloc_00;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar23;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar24;
  long lVar25;
  long in_FS_OFFSET;
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  MediumInterface MVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  span<const_float> func;
  span<const_float> func_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Array2D<float> d;
  size_t vb;
  Tuple2<pbrt::Point2,_float> TStack_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  undefined1 local_108 [16];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_f8;
  size_t local_f0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_e8;
  Float local_c8;
  Float FStack_c4;
  Float local_c0;
  string *local_b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_b0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_a8;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *local_a0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_90;
  ImageChannelDesc channelDesc;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  TStack_130 = (Tuple2<pbrt::Point2,_float>)vb;
  MVar35._0_12_ = ZEXT812(0);
  MVar35.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits._4_4_ = 0;
  (this->super_LightBase).type = Infinite;
  (this->super_LightBase).mediumInterface = MVar35;
  auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])(renderFromLight->m).m);
  auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])(renderFromLight->mInv).m);
  auVar27 = vmovdqu64_avx512f(auVar27);
  *(undefined1 (*) [64])(this->super_LightBase).renderFromLight.m.m = auVar27;
  auVar27 = vmovdqu64_avx512f(auVar28);
  *(undefined1 (*) [64])(this->super_LightBase).renderFromLight.mInv.m = auVar27;
  *(long *)(in_FS_OFFSET + -0x228) = *(long *)(in_FS_OFFSET + -0x228) + 1;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  local_b8 = &this->filename;
  pcVar2 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar2,pcVar2 + filename->_M_string_length);
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (im->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  iVar22 = (im->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = im->format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar22;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&(this->image).channelNames,&im->channelNames);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar20 = (im->p8).alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (im->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar20;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  sVar21 = (im->p8).nStored;
  (this->image).p8.nAlloc = (im->p8).nAlloc;
  (this->image).p8.nStored = sVar21;
  (this->image).p8.ptr = (im->p8).ptr;
  (im->p8).nStored = 0;
  (im->p8).ptr = (uchar *)0x0;
  (im->p8).nAlloc = 0;
  (this->image).p16.alloc.memoryResource = (im->p16).alloc.memoryResource;
  (this->image).p16.nStored = 0;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  sVar21 = (im->p16).nStored;
  (this->image).p16.nAlloc = (im->p16).nAlloc;
  (this->image).p16.nStored = sVar21;
  (this->image).p16.ptr = (im->p16).ptr;
  (im->p16).nStored = 0;
  (im->p16).ptr = (Half *)0x0;
  (im->p16).nAlloc = 0;
  (this->image).p32.alloc.memoryResource = (im->p32).alloc.memoryResource;
  (this->image).p32.nStored = 0;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  sVar21 = (im->p32).nStored;
  (this->image).p32.nAlloc = (im->p32).nAlloc;
  (this->image).p32.nStored = sVar21;
  (this->image).p32.ptr = (im->p32).ptr;
  (im->p32).nStored = 0;
  (im->p32).ptr = (float *)0x0;
  (im->p32).nAlloc = 0;
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  *(undefined8 *)(this->wrapMode).wrap.values = 0x300000003;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (this->distribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->distribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  (this->distribution).pConditionalY.alloc.memoryResource = alloc.memoryResource;
  (this->distribution).pConditionalY.ptr = (PiecewiseConstant1D *)0x0;
  (this->distribution).pConditionalY.nAlloc = 0;
  (this->distribution).pConditionalY.nStored = 0;
  (this->distribution).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->distribution).pMarginal.func.ptr = (float *)0x0;
  (this->distribution).pMarginal.func.nAlloc = 0;
  (this->distribution).pMarginal.func.nStored = 0;
  (this->distribution).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->distribution).pMarginal.cdf.ptr = (float *)0x0;
  (this->distribution).pMarginal.cdf.nAlloc = 0;
  (this->distribution).pMarginal.cdf.nStored = 0;
  (this->distribution).pMarginal.funcInt = 0.0;
  (this->compensatedDistribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->compensatedDistribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  (this->compensatedDistribution).pConditionalY.alloc.memoryResource = alloc.memoryResource;
  (this->compensatedDistribution).pConditionalY.nStored = 0;
  (this->compensatedDistribution).pConditionalY.ptr = (PiecewiseConstant1D *)0x0;
  (this->compensatedDistribution).pConditionalY.nAlloc = 0;
  (this->compensatedDistribution).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->compensatedDistribution).pMarginal.func.ptr = (float *)0x0;
  (this->compensatedDistribution).pMarginal.func.nAlloc = 0;
  (this->compensatedDistribution).pMarginal.func.nStored = 0;
  (this->compensatedDistribution).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->compensatedDistribution).pMarginal.cdf.ptr = (float *)0x0;
  (this->compensatedDistribution).pMarginal.cdf.nAlloc = 0;
  (this->compensatedDistribution).pMarginal.cdf.nStored = 0;
  (this->compensatedDistribution).pMarginal.funcInt = 0.0;
  vb = (size_t)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"G","");
  pvVar24 = &local_e8;
  local_f8 = pvVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,&this->image,requestedChannels);
  local_98 = &(this->distribution).pMarginal.cdf;
  local_a0 = &(this->compensatedDistribution).pConditionalY;
  local_90 = &(this->distribution).pMarginal.func;
  lVar25 = -0x60;
  local_a8 = &(this->compensatedDistribution).pMarginal.func;
  local_b0 = &(this->compensatedDistribution).pMarginal.cdf;
  do {
    if (pvVar24 != (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pvVar24[-1].nAlloc) {
      operator_delete((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pvVar24[-1].nAlloc,
                      (ulong)((long)&((pvVar24->alloc).memoryResource)->_vptr_memory_resource + 1));
    }
    pvVar24 = pvVar24 + -1;
    lVar25 = lVar25 + 0x20;
  } while (lVar25 != 0);
  if (channelDesc.offset.nStored != 0) {
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
    vb = channelDesc.offset.nStored;
    if (channelDesc.offset.nStored != 3) {
      LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x367,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x4aacdd,
                 (char (*) [19])"channelDesc.size()",(char (*) [2])0x4aacdd,(int *)&d,
                 (char (*) [19])"channelDesc.size()",&vb);
    }
    paVar23 = &channelDesc.offset.field_2;
    if (channelDesc.offset.ptr != (int *)0x0) {
      paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                 *)channelDesc.offset.ptr;
    }
    if (paVar23->fixed[0] == 0) {
      paVar23 = &channelDesc.offset.field_2;
      if (channelDesc.offset.ptr != (int *)0x0) {
        paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)channelDesc.offset.ptr;
      }
      if (paVar23->fixed[1] == 1) {
        paVar23 = &channelDesc.offset.field_2;
        if (channelDesc.offset.ptr != (int *)0x0) {
          paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)channelDesc.offset.ptr;
        }
        if (paVar23->fixed[2] == 2) {
          TVar3 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
          if (TVar3.x == TVar3.y) {
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            local_58 = (_Any_data)0x0;
            local_40 = std::
                       _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
                       ::_M_invoke;
            local_48 = std::
                       _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
                       ::_M_manager;
            _vb = (Bounds2f)vpunpcklqdq_avx((undefined1  [16])0x0,auVar38);
            alloc_00.memoryResource = pstd::pmr::new_delete_resource();
            Image::GetSamplingDistribution
                      (&d,&this->image,(function<float_(pbrt::Point2<float>)> *)&local_58,
                       (Bounds2f *)&vb,alloc_00);
            if (local_48 != (code *)0x0) {
              (*local_48)(&local_58,&local_58,__destroy_functor);
            }
            auVar36._8_8_ = 0;
            auVar36._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
            auVar36._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
            auVar39._8_8_ = 0;
            auVar39._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
            auVar39._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
            auVar38 = vpsubd_avx(auVar36,auVar39);
            func.n = (size_t)(auVar38._4_4_ * auVar38._0_4_);
            func.ptr = d.values;
            PiecewiseConstant2D::PiecewiseConstant2D
                      ((PiecewiseConstant2D *)&vb,func,auVar38._0_4_,auVar38._4_4_,
                       (Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),alloc);
            (this->distribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
                 (Tuple2<pbrt::Point2,_float>)vb;
            (this->distribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> = TStack_130;
            pstd::
            vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
            ::operator=(&(this->distribution).pConditionalY,
                        (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                         *)local_128);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (local_90,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_108
                      );
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (local_98,&local_e8);
            (this->distribution).pMarginal.funcInt = local_c0;
            (this->distribution).pMarginal.min = local_c8;
            (this->distribution).pMarginal.max = FStack_c4;
            local_e8.nStored = 0;
            (*(local_e8.alloc.memoryResource)->_vptr_memory_resource[3])
                      (local_e8.alloc.memoryResource,local_e8.ptr,local_e8.nAlloc << 2,4);
            local_f0 = 0;
            (*(*(_func_int ***)local_108._0_8_)[3])
                      (local_108._0_8_,local_108._8_8_,(long)local_f8 << 2,4);
            pstd::
            vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
            ::~vector((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                       *)local_128);
            auVar37._8_8_ = 0;
            auVar37._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
            auVar37._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
            auVar40._8_8_ = 0;
            auVar40._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
            auVar40._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
            auVar38 = vpsubd_avx(auVar37,auVar40);
            iVar22 = auVar38._4_4_ * auVar38._0_4_;
            func_00.n = (size_t)iVar22;
            if (iVar22 != 0) {
              dVar34 = 0.0;
              lVar25 = 0;
              do {
                pfVar1 = (float *)((long)d.values + lVar25);
                lVar25 = lVar25 + 4;
                dVar34 = dVar34 + (double)*pfVar1;
              } while (func_00.n * 4 - lVar25 != 0);
              if (iVar22 != 0) {
                auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar41._0_4_ = (float)(dVar34 / (double)iVar22);
                auVar41._4_4_ = (int)((ulong)(dVar34 / (double)iVar22) >> 0x20);
                auVar41._8_8_ = 0;
                auVar29 = vpbroadcastq_avx512f();
                lVar25 = 0;
                auVar30 = vbroadcastss_avx512f(auVar41);
                auVar31 = vbroadcastss_avx512f(ZEXT416((uint)(auVar41._0_4_ * 0.001)));
                do {
                  auVar32 = vpbroadcastq_avx512f();
                  auVar33 = vporq_avx512f(auVar32,auVar27);
                  auVar32 = vporq_avx512f(auVar32,auVar28);
                  uVar17 = vpcmpuq_avx512f(auVar32,auVar29,2);
                  bVar18 = (byte)uVar17;
                  uVar17 = vpcmpuq_avx512f(auVar33,auVar29,2);
                  bVar19 = (byte)uVar17;
                  uVar26 = CONCAT11(bVar19,bVar18);
                  pfVar1 = d.values + lVar25;
                  auVar32._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * (int)pfVar1[1];
                  auVar32._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
                  auVar32._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * (int)pfVar1[2];
                  auVar32._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * (int)pfVar1[3];
                  auVar32._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * (int)pfVar1[4];
                  auVar32._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * (int)pfVar1[5];
                  auVar32._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * (int)pfVar1[6];
                  auVar32._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * (int)pfVar1[7];
                  auVar32._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
                  auVar32._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
                  auVar32._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
                  auVar32._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
                  auVar32._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
                  auVar32._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
                  auVar32._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
                  auVar32._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
                  auVar33 = vsubps_avx512f(auVar32,auVar30);
                  auVar32 = vminps_avx512f(auVar32,auVar31);
                  auVar32 = vmaxps_avx512f(auVar32,auVar33);
                  pfVar1 = d.values + lVar25;
                  bVar4 = (bool)((byte)(uVar26 >> 1) & 1);
                  bVar5 = (bool)((byte)(uVar26 >> 2) & 1);
                  bVar6 = (bool)((byte)(uVar26 >> 3) & 1);
                  bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
                  bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
                  bVar9 = (bool)((byte)(uVar26 >> 6) & 1);
                  bVar10 = (bool)((byte)(uVar26 >> 7) & 1);
                  bVar11 = (bool)(bVar19 >> 1 & 1);
                  bVar12 = (bool)(bVar19 >> 2 & 1);
                  bVar13 = (bool)(bVar19 >> 3 & 1);
                  bVar14 = (bool)(bVar19 >> 4 & 1);
                  bVar15 = (bool)(bVar19 >> 5 & 1);
                  bVar16 = (bool)(bVar19 >> 6 & 1);
                  *pfVar1 = (float)((uint)(bVar18 & 1) * auVar32._0_4_ |
                                   (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
                  pfVar1[1] = (float)((uint)bVar4 * auVar32._4_4_ | (uint)!bVar4 * (int)pfVar1[1]);
                  pfVar1[2] = (float)((uint)bVar5 * auVar32._8_4_ | (uint)!bVar5 * (int)pfVar1[2]);
                  pfVar1[3] = (float)((uint)bVar6 * auVar32._12_4_ | (uint)!bVar6 * (int)pfVar1[3]);
                  pfVar1[4] = (float)((uint)bVar7 * auVar32._16_4_ | (uint)!bVar7 * (int)pfVar1[4]);
                  pfVar1[5] = (float)((uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
                  pfVar1[6] = (float)((uint)bVar9 * auVar32._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
                  pfVar1[7] = (float)((uint)bVar10 * auVar32._28_4_ | (uint)!bVar10 * (int)pfVar1[7]
                                     );
                  pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar32._32_4_ |
                                     (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
                  pfVar1[9] = (float)((uint)bVar11 * auVar32._36_4_ | (uint)!bVar11 * (int)pfVar1[9]
                                     );
                  pfVar1[10] = (float)((uint)bVar12 * auVar32._40_4_ |
                                      (uint)!bVar12 * (int)pfVar1[10]);
                  pfVar1[0xb] = (float)((uint)bVar13 * auVar32._44_4_ |
                                       (uint)!bVar13 * (int)pfVar1[0xb]);
                  pfVar1[0xc] = (float)((uint)bVar14 * auVar32._48_4_ |
                                       (uint)!bVar14 * (int)pfVar1[0xc]);
                  pfVar1[0xd] = (float)((uint)bVar15 * auVar32._52_4_ |
                                       (uint)!bVar15 * (int)pfVar1[0xd]);
                  pfVar1[0xe] = (float)((uint)bVar16 * auVar32._56_4_ |
                                       (uint)!bVar16 * (int)pfVar1[0xe]);
                  pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar32._60_4_ |
                                       (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
                  lVar25 = lVar25 + 0x10;
                } while (((func_00.n + 0x3fffffffffffffff & 0x3fffffffffffffff) + 0x10) -
                         (ulong)((uint)(func_00.n + 0x3fffffffffffffff) & 0xf) != lVar25);
              }
            }
            func_00.ptr = d.values;
            PiecewiseConstant2D::PiecewiseConstant2D
                      ((PiecewiseConstant2D *)&vb,func_00,auVar38._0_4_,auVar38._4_4_,
                       (Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),alloc);
            (this->compensatedDistribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
                 (Tuple2<pbrt::Point2,_float>)vb;
            (this->compensatedDistribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
                 TStack_130;
            pstd::
            vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
            ::operator=(local_a0,(vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                                  *)local_128);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (local_a8,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_108
                      );
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (local_b0,&local_e8);
            (this->compensatedDistribution).pMarginal.funcInt = local_c0;
            (this->compensatedDistribution).pMarginal.min = local_c8;
            (this->compensatedDistribution).pMarginal.max = FStack_c4;
            local_e8.nStored = 0;
            (*(local_e8.alloc.memoryResource)->_vptr_memory_resource[3])
                      (local_e8.alloc.memoryResource,local_e8.ptr,local_e8.nAlloc << 2,4);
            local_f0 = 0;
            (*(*(_func_int ***)local_108._0_8_)[3])
                      (local_108._0_8_,local_108._8_8_,(long)local_f8 << 2,4);
            pstd::
            vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
            ::~vector((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                       *)local_128);
            Array2D<float>::~Array2D(&d);
            channelDesc.offset.nStored = 0;
            (*(channelDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                      (channelDesc.offset.alloc.memoryResource,channelDesc.offset.ptr,
                       channelDesc.offset.nAlloc << 2,4);
            return;
          }
          vb._0_4_ = TVar3.x;
          vb._4_4_ = TVar3.y;
          d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar3;
          ErrorExit<std::__cxx11::string_const&,int,int>
                    ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equirect environment map."
                     ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
        }
      }
    }
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x368,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  ErrorExit<std::__cxx11::string_const&>
            ("%s: image used for ImageInfiniteLight doesn\'t have R, G, B channels.",filename);
}

Assistant:

ImageInfiniteLight::ImageInfiniteLight(const Transform &renderFromLight, Image im,
                                       const RGBColorSpace *imageColorSpace, Float scale,
                                       const std::string &filename, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      wrapMode(WrapMode::OctahedralSphere, WrapMode::OctahedralSphere),
      distribution(alloc),
      compensatedDistribution(alloc) {
    // Initialize sampling PDFs for image infinite area light
    ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for ImageInfiniteLight doesn't have R, G, B "
                  "channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());
    if (image.Resolution().x != image.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equirect environment map.",
                  filename, image.Resolution().x, image.Resolution().y);
    Array2D<Float> d = image.GetSamplingDistribution();
    Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
    distribution = PiecewiseConstant2D(d, domain, alloc);

    // Initialize compensated PDF for image infinite area light
    Float average = std::accumulate(d.begin(), d.end(), 0.) / d.size();
    for (Float &v : d)
        v = std::max<Float>(v - average, std::min<Float>(.001f * average, v));
    compensatedDistribution = PiecewiseConstant2D(d, domain, alloc);
}